

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O2

void __thiscall
Assimp::HMPImporter::InternReadFile
          (HMPImporter *this,string *pFile,aiScene *_pScene,IOSystem *_pIOHandler)

{
  aiScene *paVar1;
  int iVar2;
  int extraout_EAX;
  undefined4 extraout_var;
  ulong uVar4;
  uchar *puVar5;
  Logger *pLVar6;
  DeadlyImportError *pDVar7;
  char szBuffer [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long *plVar3;
  
  (this->super_MDLImporter).pScene = _pScene;
  (this->super_MDLImporter).pIOHandler = _pIOHandler;
  std::__cxx11::string::string((string *)&local_a8,"rb",(allocator *)&local_88);
  iVar2 = (*_pIOHandler->_vptr_IOSystem[4])
                    (_pIOHandler,(pFile->_M_dataplus)._M_p,local_a8._M_dataplus._M_p);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  std::__cxx11::string::~string((string *)&local_a8);
  if (plVar3 == (long *)0x0) {
    pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_88,"Failed to open HMP file ",pFile);
    std::operator+(&local_a8,&local_88,".");
    DeadlyImportError::DeadlyImportError(pDVar7,&local_a8);
    __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar4 = (**(code **)(*plVar3 + 0x30))(plVar3);
  if (uVar4 < 0x32) {
    pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_a8,"HMP File is too small.",(allocator *)&local_88);
    DeadlyImportError::DeadlyImportError(pDVar7,&local_a8);
    __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar5 = (uchar *)operator_new__(uVar4);
  (this->super_MDLImporter).mBuffer = puVar5;
  (**(code **)(*plVar3 + 0x10))(plVar3,puVar5,1,uVar4);
  (this->super_MDLImporter).iFileSize = (uint)uVar4;
  iVar2 = *(int *)(this->super_MDLImporter).mBuffer;
  if (iVar2 == 0x35504d48) {
LAB_003fee52:
    pLVar6 = DefaultLogger::get();
    Logger::debug(pLVar6,"HMP subtype: 3D GameStudio A5, magic word is HMP5");
    InternReadFile_HMP5(this);
  }
  else {
    if (iVar2 != 0x37504d48) {
      if (iVar2 == 0x484d5035) goto LAB_003fee52;
      if (iVar2 != 0x484d5037) {
        if ((iVar2 == 0x484d5034) || (iVar2 == 0x34504d48)) {
          pLVar6 = DefaultLogger::get();
          Logger::debug(pLVar6,"HMP subtype: 3D GameStudio A4, magic word is HMP4");
          InternReadFile_HMP4((HMPImporter *)pLVar6);
          iVar2 = extraout_EAX;
        }
        szBuffer[0] = (char)iVar2;
        szBuffer[1] = (char)((uint)iVar2 >> 8);
        szBuffer[2] = (char)((uint)iVar2 >> 0x10);
        szBuffer[3] = (char)((uint)iVar2 >> 0x18);
        szBuffer[4] = '\0';
        pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::operator+(&local_68,"Unknown HMP subformat ",pFile);
        std::operator+(&local_48,&local_68,". Magic word (");
        std::operator+(&local_88,&local_48,szBuffer);
        std::operator+(&local_a8,&local_88,") is not known");
        DeadlyImportError::DeadlyImportError(pDVar7,&local_a8);
        __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    pLVar6 = DefaultLogger::get();
    Logger::debug(pLVar6,"HMP subtype: 3D GameStudio A7, magic word is HMP7");
    InternReadFile_HMP7(this);
  }
  paVar1 = (this->super_MDLImporter).pScene;
  paVar1->mFlags = paVar1->mFlags | 0x10;
  puVar5 = (this->super_MDLImporter).mBuffer;
  if (puVar5 != (uchar *)0x0) {
    operator_delete__(puVar5);
  }
  (this->super_MDLImporter).mBuffer = (uchar *)0x0;
  (**(code **)(*plVar3 + 8))(plVar3);
  return;
}

Assistant:

void HMPImporter::InternReadFile( const std::string& pFile,
                                 aiScene* _pScene, IOSystem* _pIOHandler)
{
    pScene     = _pScene;
    pIOHandler = _pIOHandler;
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open HMP file " + pFile + ".");

    // Check whether the HMP file is large enough to contain
    // at least the file header
    const size_t fileSize = file->FileSize();
    if( fileSize < 50)
        throw DeadlyImportError( "HMP File is too small.");

    // Allocate storage and copy the contents of the file to a memory buffer
    mBuffer = new uint8_t[fileSize];
    file->Read( (void*)mBuffer, 1, fileSize);
    iFileSize = (unsigned int)fileSize;

    // Determine the file subtype and call the appropriate member function
    const uint32_t iMagic = *((uint32_t*)this->mBuffer);

    // HMP4 format
    if (AI_HMP_MAGIC_NUMBER_LE_4 == iMagic ||
        AI_HMP_MAGIC_NUMBER_BE_4 == iMagic)
    {
        ASSIMP_LOG_DEBUG("HMP subtype: 3D GameStudio A4, magic word is HMP4");
        InternReadFile_HMP4();
    }
    // HMP5 format
    else if (AI_HMP_MAGIC_NUMBER_LE_5 == iMagic ||
             AI_HMP_MAGIC_NUMBER_BE_5 == iMagic)
    {
        ASSIMP_LOG_DEBUG("HMP subtype: 3D GameStudio A5, magic word is HMP5");
        InternReadFile_HMP5();
    }
    // HMP7 format
    else if (AI_HMP_MAGIC_NUMBER_LE_7 == iMagic ||
             AI_HMP_MAGIC_NUMBER_BE_7 == iMagic)
    {
        ASSIMP_LOG_DEBUG("HMP subtype: 3D GameStudio A7, magic word is HMP7");
        InternReadFile_HMP7();
    }
    else
    {
        // Print the magic word to the logger
        char szBuffer[5];
        szBuffer[0] = ((char*)&iMagic)[0];
        szBuffer[1] = ((char*)&iMagic)[1];
        szBuffer[2] = ((char*)&iMagic)[2];
        szBuffer[3] = ((char*)&iMagic)[3];
        szBuffer[4] = '\0';

        // We're definitely unable to load this file
        throw DeadlyImportError( "Unknown HMP subformat " + pFile +
            ". Magic word (" + szBuffer + ") is not known");
    }

    // Set the AI_SCENE_FLAGS_TERRAIN bit
    pScene->mFlags |= AI_SCENE_FLAGS_TERRAIN;

    delete[] mBuffer;
    mBuffer= nullptr;

}